

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::ConfigBlockSymbol::checkUnusedRules(ConfigBlockSymbol *this)

{
  char_pointer puVar1;
  char_pointer puVar2;
  char_pointer puVar3;
  ConfigRule *rule;
  uint uVar4;
  char_pointer puVar5;
  char_pointer puVar6;
  char_pointer puVar7;
  uint uVar8;
  table_element_pointer_conflict ppVar9;
  table_element_pointer ppVar10;
  char_pointer puVar11;
  char_pointer puVar12;
  char_pointer puVar13;
  table_element_pointer ppVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  iterator iVar18;
  iterator_conflict iVar19;
  iterator iVar20;
  
  if (this->resolved == false) {
    resolve(this);
  }
  iVar18 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
           ::begin(&(this->cellOverrides).table_);
  if (iVar18.p_ != (table_element_pointer)0x0) {
LAB_00443fbf:
    rule = ((iVar18.p_)->second).defaultRule;
    if (rule != (ConfigRule *)0x0) {
      checkRuleUnused(&this->super_Scope,rule,true);
    }
    iVar19 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                      *)&(iVar18.p_)->second);
    if (iVar19.p_ != (table_element_pointer_conflict)0x0) {
LAB_00443fef:
      checkRuleUnused(&this->super_Scope,(iVar19.p_)->second,true);
      puVar5 = iVar19.pc_ + 2;
      do {
        puVar11 = puVar5;
        puVar5 = iVar19.pc_;
        ppVar9 = iVar19.p_ + 1;
        if (((uint)iVar19.pc_ & 0xf) == 0xe) goto LAB_00444038;
        puVar1 = puVar11 + -1;
        iVar19.p_ = ppVar9;
        iVar19.pc_ = puVar5 + 1;
        puVar5 = puVar11 + 1;
      } while (*puVar1 == '\0');
      puVar11 = puVar11 + -1;
      if (*puVar1 == '\x01') {
        ppVar9 = (table_element_pointer_conflict)0x0;
      }
      goto LAB_0044402d;
    }
LAB_00444089:
    puVar6 = iVar18.pc_ + 2;
    do {
      puVar12 = puVar6;
      puVar6 = iVar18.pc_;
      ppVar10 = iVar18.p_ + 1;
      if (((uint)iVar18.pc_ & 0xf) == 0xe) goto LAB_004440c6;
      puVar2 = puVar12 + -1;
      iVar18.p_ = ppVar10;
      iVar18.pc_ = puVar6 + 1;
      puVar6 = puVar12 + 1;
    } while (*puVar2 == '\0');
    puVar12 = puVar12 + -1;
    if (*puVar2 == '\x01') {
      ppVar10 = (table_element_pointer)0x0;
    }
    goto LAB_004440b6;
  }
LAB_00444118:
  if (this->resolved == false) {
    resolve(this);
  }
  iVar20 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin(&(this->instanceOverrides).table_);
  if (iVar20.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_00444154:
  checkNodeUnused(&this->super_Scope,&(iVar20.p_)->second);
  puVar7 = iVar20.pc_ + 2;
  do {
    puVar13 = puVar7;
    puVar7 = iVar20.pc_;
    ppVar14 = iVar20.p_ + 1;
    if (((uint)iVar20.pc_ & 0xf) == 0xe) goto LAB_00444199;
    puVar3 = puVar13 + -1;
    iVar20.p_ = ppVar14;
    iVar20.pc_ = puVar7 + 1;
    puVar7 = puVar13 + 1;
  } while (*puVar3 == '\0');
  puVar13 = puVar13 + -1;
  if (*puVar3 == '\x01') {
    ppVar14 = (table_element_pointer)0x0;
  }
  goto LAB_0044418d;
LAB_00444038:
  do {
    auVar15[0] = -(*puVar11 == '\0');
    auVar15[1] = -(puVar11[1] == '\0');
    auVar15[2] = -(puVar11[2] == '\0');
    auVar15[3] = -(puVar11[3] == '\0');
    auVar15[4] = -(puVar11[4] == '\0');
    auVar15[5] = -(puVar11[5] == '\0');
    auVar15[6] = -(puVar11[6] == '\0');
    auVar15[7] = -(puVar11[7] == '\0');
    auVar15[8] = -(puVar11[8] == '\0');
    auVar15[9] = -(puVar11[9] == '\0');
    auVar15[10] = -(puVar11[10] == '\0');
    auVar15[0xb] = -(puVar11[0xb] == '\0');
    auVar15[0xc] = -(puVar11[0xc] == '\0');
    auVar15[0xd] = -(puVar11[0xd] == '\0');
    auVar15[0xe] = -(puVar11[0xe] == '\0');
    auVar15[0xf] = -(puVar11[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar11 = puVar11 + 0x10;
      ppVar9 = ppVar9 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar11[uVar4] == '\x01') {
        ppVar9 = (table_element_pointer_conflict)0x0;
      }
      else {
        puVar11 = puVar11 + uVar4;
        ppVar9 = (table_element_pointer_conflict)((long)&ppVar9->first + (ulong)(uVar4 << 4));
      }
    }
  } while (uVar8 == 0x7fff);
LAB_0044402d:
  iVar19.p_ = ppVar9;
  iVar19.pc_ = puVar11;
  if (ppVar9 == (table_element_pointer_conflict)0x0) goto LAB_00444089;
  goto LAB_00443fef;
LAB_004440c6:
  do {
    auVar16[0] = -(*puVar12 == '\0');
    auVar16[1] = -(puVar12[1] == '\0');
    auVar16[2] = -(puVar12[2] == '\0');
    auVar16[3] = -(puVar12[3] == '\0');
    auVar16[4] = -(puVar12[4] == '\0');
    auVar16[5] = -(puVar12[5] == '\0');
    auVar16[6] = -(puVar12[6] == '\0');
    auVar16[7] = -(puVar12[7] == '\0');
    auVar16[8] = -(puVar12[8] == '\0');
    auVar16[9] = -(puVar12[9] == '\0');
    auVar16[10] = -(puVar12[10] == '\0');
    auVar16[0xb] = -(puVar12[0xb] == '\0');
    auVar16[0xc] = -(puVar12[0xc] == '\0');
    auVar16[0xd] = -(puVar12[0xd] == '\0');
    auVar16[0xe] = -(puVar12[0xe] == '\0');
    auVar16[0xf] = -(puVar12[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar12 = puVar12 + 0x10;
      ppVar10 = ppVar10 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar12[uVar4] == '\x01') {
        ppVar10 = (table_element_pointer)0x0;
      }
      else {
        puVar12 = puVar12 + uVar4;
        ppVar10 = ppVar10 + uVar4;
      }
    }
  } while (uVar8 == 0x7fff);
LAB_004440b6:
  iVar18.p_ = ppVar10;
  iVar18.pc_ = puVar12;
  if (ppVar10 == (table_element_pointer)0x0) goto LAB_00444118;
  goto LAB_00443fbf;
LAB_00444199:
  do {
    auVar17[0] = -(*puVar13 == '\0');
    auVar17[1] = -(puVar13[1] == '\0');
    auVar17[2] = -(puVar13[2] == '\0');
    auVar17[3] = -(puVar13[3] == '\0');
    auVar17[4] = -(puVar13[4] == '\0');
    auVar17[5] = -(puVar13[5] == '\0');
    auVar17[6] = -(puVar13[6] == '\0');
    auVar17[7] = -(puVar13[7] == '\0');
    auVar17[8] = -(puVar13[8] == '\0');
    auVar17[9] = -(puVar13[9] == '\0');
    auVar17[10] = -(puVar13[10] == '\0');
    auVar17[0xb] = -(puVar13[0xb] == '\0');
    auVar17[0xc] = -(puVar13[0xc] == '\0');
    auVar17[0xd] = -(puVar13[0xd] == '\0');
    auVar17[0xe] = -(puVar13[0xe] == '\0');
    auVar17[0xf] = -(puVar13[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar13 = puVar13 + 0x10;
      ppVar14 = ppVar14 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar13[uVar4] == '\x01') {
        ppVar14 = (table_element_pointer)0x0;
      }
      else {
        puVar13 = puVar13 + uVar4;
        ppVar14 = ppVar14 + uVar4;
      }
    }
  } while (uVar8 == 0x7fff);
LAB_0044418d:
  iVar20.p_ = ppVar14;
  iVar20.pc_ = puVar13;
  if (ppVar14 == (table_element_pointer)0x0) {
    return;
  }
  goto LAB_00444154;
}

Assistant:

void ConfigBlockSymbol::checkUnusedRules() const {
    for (auto& [_, cellOverride] : getCellOverrides()) {
        if (cellOverride.defaultRule)
            checkRuleUnused(*this, *cellOverride.defaultRule, true);

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            checkRuleUnused(*this, *rule, true);
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        checkNodeUnused(*this, instOverride);
}